

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImRect GetResizeBorderRect(ImGuiWindow_conflict *window,int border_n,float perp_padding,
                          float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  
  IVar7 = ImGuiWindow::Rect((ImGuiWindow *)window);
  fVar4 = IVar7.Max.x;
  fVar5 = IVar7.Max.y;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar4 = fVar4 + -1.0;
    fVar5 = fVar5 + -1.0;
  }
  fVar1 = IVar7.Min.x;
  fVar3 = IVar7.Min.y;
  switch(border_n) {
  case 0:
    fVar2 = fVar1 - thickness;
    fVar6 = fVar3 + perp_padding;
    fVar4 = thickness + fVar1;
    fVar5 = fVar5 - perp_padding;
    break;
  case 1:
    fVar2 = fVar4 - thickness;
    fVar6 = fVar3 + perp_padding;
    fVar4 = thickness + fVar4;
    fVar5 = fVar5 - perp_padding;
    break;
  case 2:
    fVar2 = fVar1 + perp_padding;
    fVar6 = fVar3 - thickness;
    fVar4 = fVar4 - perp_padding;
    fVar5 = fVar3 + thickness;
    break;
  case 3:
    fVar2 = fVar1 + perp_padding;
    fVar6 = fVar5 - thickness;
    fVar4 = fVar4 - perp_padding;
    fVar5 = fVar5 + thickness;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0x163b,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
  }
  IVar7.Min.y = fVar6;
  IVar7.Min.x = fVar2;
  IVar7.Max.y = fVar5;
  IVar7.Max.x = fVar4;
  return IVar7;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f)
        rect.Max -= ImVec2(1, 1);
    if (border_n == ImGuiDir_Left)  { return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding); }
    if (border_n == ImGuiDir_Right) { return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding); }
    if (border_n == ImGuiDir_Up)    { return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);    }
    if (border_n == ImGuiDir_Down)  { return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);    }
    IM_ASSERT(0);
    return ImRect();
}